

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_filter.cpp
# Opt level: O2

bool __thiscall
duckdb::ExpressionFilter::EvaluateWithConstant
          (ExpressionFilter *this,ExpressionExecutor *executor,Value *val)

{
  idx_t iVar1;
  SelectionVector sel;
  DataChunk input;
  
  DataChunk::DataChunk(&input);
  ::std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::emplace_back<duckdb::Value_const&>
            ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&input,val);
  input.count = 1;
  SelectionVector::SelectionVector(&sel,1);
  iVar1 = ExpressionExecutor::SelectExpression(executor,&input,&sel);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  DataChunk::~DataChunk(&input);
  return iVar1 != 0;
}

Assistant:

bool ExpressionFilter::EvaluateWithConstant(ExpressionExecutor &executor, const Value &val) const {
	DataChunk input;
	input.data.emplace_back(val);
	input.SetCardinality(1);

	SelectionVector sel(1);

	idx_t count = executor.SelectExpression(input, sel);
	return count > 0;
}